

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall Test::phase(Test *this)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  Phase ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ");
  this->nr_phases = this->nr_phases + 1;
  if (this->nr_tests == this->nr_passed_tests) {
    this->nr_passed_phases = this->nr_passed_phases + 1;
    pcVar2 = "[PASS]";
  }
  else {
    pcVar2 = "[FAIL]";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  this->nr_tests = 0;
  this->nr_passed_tests = 0;
  return;
}

Assistant:

void phase(void) {
    // Report
    std::cout << "  Phase " << (nr_phases + 1) << ": ";
    std::cout << nr_passed_tests << "/" << nr_tests << " ";

    // Count
    ++nr_phases;
    if (nr_tests == nr_passed_tests) {
      ++nr_passed_phases;
      std::cout << "[PASS]" << std::endl;
    } else
      std::cout << "[FAIL]" << std::endl;

    std::cout.flush();

    // Reset
    nr_tests = 0;
    nr_passed_tests = 0;
  }